

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

Quat<double> * Imath_3_2::extractQuat<double>(Matrix44<double> *mat)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Matrix44<double> *in_RSI;
  Quat<double> *in_RDI;
  int nxt [3];
  int k;
  int j;
  int i;
  double q [4];
  double s;
  double tr;
  Quat<double> *quat;
  int local_60 [4];
  int local_50;
  int local_4c;
  double local_48 [5];
  double local_20;
  double local_18;
  Matrix44<double> *local_10;
  
  local_10 = in_RSI;
  Quat<double>::Quat((Quat<double> *)0x19bbf9);
  local_60[0] = 1;
  local_60[1] = 2;
  local_60[2] = 0;
  pdVar3 = Matrix44<double>::operator[](local_10,0);
  dVar1 = *pdVar3;
  pdVar3 = Matrix44<double>::operator[](local_10,1);
  dVar2 = pdVar3[1];
  pdVar3 = Matrix44<double>::operator[](local_10,2);
  local_18 = dVar1 + dVar2 + pdVar3[2];
  if (local_18 <= 0.0) {
    local_4c = 0;
    pdVar3 = Matrix44<double>::operator[](local_10,1);
    dVar1 = pdVar3[1];
    pdVar3 = Matrix44<double>::operator[](local_10,0);
    if (*pdVar3 <= dVar1 && dVar1 != *pdVar3) {
      local_4c = 1;
    }
    pdVar3 = Matrix44<double>::operator[](local_10,2);
    dVar1 = pdVar3[2];
    pdVar3 = Matrix44<double>::operator[](local_10,local_4c);
    if (pdVar3[local_4c] <= dVar1 && dVar1 != pdVar3[local_4c]) {
      local_4c = 2;
    }
    local_50 = local_60[local_4c];
    local_60[3] = local_60[local_60[local_4c]];
    pdVar3 = Matrix44<double>::operator[](local_10,local_4c);
    dVar1 = pdVar3[local_4c];
    pdVar3 = Matrix44<double>::operator[](local_10,local_50);
    dVar2 = pdVar3[local_50];
    pdVar3 = Matrix44<double>::operator[](local_10,local_60[3]);
    local_20 = sqrt((dVar1 - (dVar2 + pdVar3[local_60[3]])) + 1.0);
    local_48[local_4c] = local_20 * 0.5;
    if ((local_20 != 0.0) || (NAN(local_20))) {
      local_20 = 0.5 / local_20;
    }
    pdVar3 = Matrix44<double>::operator[](local_10,local_50);
    dVar1 = pdVar3[local_60[3]];
    pdVar3 = Matrix44<double>::operator[](local_10,local_60[3]);
    local_48[3] = (dVar1 - pdVar3[local_50]) * local_20;
    pdVar3 = Matrix44<double>::operator[](local_10,local_4c);
    dVar1 = pdVar3[local_50];
    pdVar3 = Matrix44<double>::operator[](local_10,local_50);
    local_48[local_50] = (dVar1 + pdVar3[local_4c]) * local_20;
    pdVar3 = Matrix44<double>::operator[](local_10,local_4c);
    dVar1 = pdVar3[local_60[3]];
    pdVar3 = Matrix44<double>::operator[](local_10,local_60[3]);
    local_48[local_60[3]] = (dVar1 + pdVar3[local_4c]) * local_20;
    (in_RDI->v).x = local_48[0];
    (in_RDI->v).y = local_48[1];
    (in_RDI->v).z = local_48[2];
    in_RDI->r = local_48[3];
  }
  else {
    local_20 = sqrt(local_18 + 1.0);
    in_RDI->r = local_20 / 2.0;
    local_20 = 0.5 / local_20;
    pdVar3 = Matrix44<double>::operator[](local_10,1);
    dVar1 = pdVar3[2];
    pdVar3 = Matrix44<double>::operator[](local_10,2);
    (in_RDI->v).x = (dVar1 - pdVar3[1]) * local_20;
    pdVar3 = Matrix44<double>::operator[](local_10,2);
    dVar1 = *pdVar3;
    pdVar3 = Matrix44<double>::operator[](local_10,0);
    (in_RDI->v).y = (dVar1 - pdVar3[2]) * local_20;
    pdVar3 = Matrix44<double>::operator[](local_10,0);
    dVar1 = pdVar3[1];
    pdVar3 = Matrix44<double>::operator[](local_10,1);
    (in_RDI->v).z = (dVar1 - *pdVar3) * local_20;
  }
  return in_RDI;
}

Assistant:

Quat<T>
extractQuat (const Matrix44<T>& mat)
{
    T       tr, s;
    T       q[4];
    int     i, j, k;
    Quat<T> quat;

    int nxt[3] = {1, 2, 0};
    tr         = mat[0][0] + mat[1][1] + mat[2][2];

    // check the diagonal
    if (tr > 0.0)
    {
        s      = std::sqrt (tr + T (1.0));
        quat.r = s / T (2.0);
        s      = T (0.5) / s;

        quat.v.x = (mat[1][2] - mat[2][1]) * s;
        quat.v.y = (mat[2][0] - mat[0][2]) * s;
        quat.v.z = (mat[0][1] - mat[1][0]) * s;
    }
    else
    {
        // diagonal is negative
        i = 0;
        if (mat[1][1] > mat[0][0]) i = 1;
        if (mat[2][2] > mat[i][i]) i = 2;

        j = nxt[i];
        k = nxt[j];
        s = std::sqrt ((mat[i][i] - (mat[j][j] + mat[k][k])) + T (1.0));

        q[i] = s * T (0.5);
        if (s != T (0.0)) s = T (0.5) / s;

        q[3] = (mat[j][k] - mat[k][j]) * s;
        q[j] = (mat[i][j] + mat[j][i]) * s;
        q[k] = (mat[i][k] + mat[k][i]) * s;

        quat.v.x = q[0];
        quat.v.y = q[1];
        quat.v.z = q[2];
        quat.r   = q[3];
    }

    return quat;
}